

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_1_chaining_infix_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_CHAIN,G->val[-2]);
  G->ss = pPVar1;
  G->val[-2] = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_chaining_infix_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define f2 G->val[-1]
#define f1 G->val[-2]
  yyprintf((stderr, "do yy_1_chaining_infix_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_CHAIN, f1); f1=yy; }\n"));
  yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_CHAIN, f1); f1=yy; ;
#undef f2
#undef f1
}